

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

bool decompressHigu(vector<unsigned_char,_std::allocator<unsigned_char>_> *output,uint8_t *input,
                   int inputLength,bool isSwitch)

{
  int iVar1;
  pointer *ppuVar2;
  byte bVar3;
  byte bVar4;
  pointer puVar5;
  iterator iVar6;
  byte bVar7;
  long lVar8;
  uchar *__args;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  puVar5 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  if (0 < inputLength) {
    iVar9 = 0;
    uVar11 = 1;
    do {
      if (uVar11 == 1) {
        lVar8 = (long)iVar9;
        iVar9 = iVar9 + 1;
        uVar11 = input[lVar8] | 0x100;
      }
      if (inputLength <= iVar9) {
        return true;
      }
      if ((uVar11 & 1) == 0) {
        iVar6._M_current =
             (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)output,iVar6,
                     input + iVar9);
          iVar9 = iVar9 + 1;
        }
        else {
          *iVar6._M_current = input[iVar9];
          ppuVar2 = &(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
          iVar9 = iVar9 + 1;
        }
      }
      else {
        iVar1 = iVar9 + 2;
        if (inputLength < iVar1) {
          return false;
        }
        bVar3 = input[iVar9];
        bVar4 = input[(long)iVar9 + 1];
        bVar7 = bVar3 << 4 | bVar3 >> 4;
        if (!isSwitch) {
          bVar7 = bVar3;
        }
        iVar10 = (bVar7 & 0xf) + 3;
        do {
          puVar5 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar6._M_current =
               (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          lVar8 = (long)iVar6._M_current -
                  (long)(puVar5 + ((uint)bVar4 + (bVar7 & 0xf0) * 0x10 + 1));
          if (lVar8 < 0) {
            return false;
          }
          __args = puVar5 + lVar8;
          if (iVar6._M_current ==
              (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)output,iVar6,__args);
          }
          else {
            *iVar6._M_current = *__args;
            ppuVar2 = &(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar2 = *ppuVar2 + 1;
          }
          iVar10 = iVar10 + -1;
          iVar9 = iVar1;
        } while (iVar10 != 0);
      }
      uVar11 = uVar11 >> 1;
    } while (iVar9 < inputLength);
  }
  return true;
}

Assistant:

bool decompressHigu(std::vector<uint8_t> &output, const uint8_t *input, int inputLength, bool isSwitch) {
	int marker = 1;
	int p = 0;

	output.clear();

	while (p < inputLength) {
		if (marker == 1) {
			marker = 0x100 | input[p++];
		}

		if (p >= inputLength) {
			break;
		}

		if (marker & 1) {
			if (p + 2 > inputLength) {
				return false;
			}
			uint8_t b1 = input[p++];
			uint8_t b2 = input[p++];

			if (isSwitch) {
				b1 = (b1 >> 4) | (b1 << 4);
			}

			int count = (b1 & 0x0F) + 3;
			int offset = ((b1 & 0xF0) << 4) | b2;

			for (int i = 0; i < count; i++) {
				ptrdiff_t index = output.size() - (offset + 1);
				if (index < 0) {
					return false;
				}
				output.push_back(output[index]);
			}
		}
		else {
			output.push_back(input[p++]);
		}

		marker >>= 1;
	}
	return true;
}